

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementText.cpp
# Opt level: O0

void __thiscall
Rml::ElementText::OnPropertyChange(ElementText *this,PropertyIdSet *changed_properties)

{
  bool bVar1;
  TextDecoration TVar2;
  bool bVar3;
  pointer this_00;
  type this_01;
  undefined1 local_b8 [40];
  RenderManager *render_manager;
  Vertex *vertex;
  iterator __end4;
  iterator __begin4;
  Vector<Vertex> *__range4;
  Mesh mesh;
  Colourb local_35;
  Colour<unsigned_char,_255,_true> local_31;
  byte local_2d;
  undefined1 auStack_2c [3];
  ColourbPremultiplied new_colour;
  bool opacity_changed;
  float new_opacity;
  ComputedValues *computed;
  bool font_face_changed;
  bool colour_changed;
  PropertyIdSet *changed_properties_local;
  ElementText *this_local;
  
  Element::OnPropertyChange(&this->super_Element,changed_properties);
  computed._7_1_ = false;
  bVar3 = false;
  register0x00000000 = Element::GetComputedValues(&this->super_Element);
  bVar1 = PropertyIdSet::Contains(changed_properties,Color);
  if ((bVar1) || (bVar1 = PropertyIdSet::Contains(changed_properties,Opacity), bVar1)) {
    _auStack_2c = Style::ComputedValues::opacity(stack0xffffffffffffffd8);
    local_2d = this->opacity != _auStack_2c;
    local_35 = Style::ComputedValues::color(stack0xffffffffffffffd8);
    register0x00000000 =
         Colour<unsigned_char,255,false>::ToPremultiplied<std::integral_constant<bool,false>,void>
                   ((Colour<unsigned_char,255,false> *)&local_35,_auStack_2c);
    local_31 = register0x00000000;
    computed._7_1_ = Colour<unsigned_char,_255,_true>::operator!=(&this->colour,register0x00000000);
    if (computed._7_1_) {
      (this->colour).red = local_31.red;
      (this->colour).green = local_31.green;
      (this->colour).blue = local_31.blue;
      (this->colour).alpha = local_31.alpha;
    }
    if ((local_2d & 1) != 0) {
      this->opacity = _auStack_2c;
      this->font_effects_dirty = true;
      this->field_0x1ec = this->field_0x1ec & 0xfe | 1;
    }
  }
  bVar1 = PropertyIdSet::Contains(changed_properties,FontFamily);
  if (((((bVar1) || (bVar1 = PropertyIdSet::Contains(changed_properties,FontWeight), bVar1)) ||
       (bVar1 = PropertyIdSet::Contains(changed_properties,FontStyle), bVar1)) ||
      ((bVar1 = PropertyIdSet::Contains(changed_properties,FontSize), bVar1 ||
       (bVar1 = PropertyIdSet::Contains(changed_properties,LetterSpacing), bVar1)))) ||
     ((bVar1 = PropertyIdSet::Contains(changed_properties,RmlUi_Language), bVar1 ||
      (bVar1 = PropertyIdSet::Contains(changed_properties,RmlUi_Direction), bVar1)))) {
    bVar3 = true;
    ::std::
    vector<Rml::ElementText::TexturedGeometry,_std::allocator<Rml::ElementText::TexturedGeometry>_>
    ::clear(&this->geometry);
    this->field_0x1ec = this->field_0x1ec & 0xfe | 1;
    this->font_effects_handle = 0;
    this->font_effects_dirty = true;
    this->font_handle_version = 0;
  }
  bVar1 = PropertyIdSet::Contains(changed_properties,FontEffect);
  if (bVar1) {
    this->font_effects_dirty = true;
  }
  bVar1 = PropertyIdSet::Contains(changed_properties,TextDecoration);
  if (bVar1) {
    TVar2 = Style::ComputedValues::text_decoration(stack0xffffffffffffffd8);
    this->decoration_property = TVar2;
    bVar1 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->decoration);
    if ((bVar1) && (this->decoration_property == None)) {
      ::std::unique_ptr<Rml::Geometry,_std::default_delete<Rml::Geometry>_>::reset
                (&this->decoration,(pointer)0x0);
    }
  }
  if (bVar3) {
    if (((byte)this->field_0x1ec >> 1 & 1) != 0) {
      Element::DirtyLayout(&this->super_Element);
    }
  }
  else if (computed._7_1_ != false) {
    this->field_0x1ec = this->field_0x1ec & 0xfe | 1;
    bVar3 = ::std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->decoration);
    if (bVar3) {
      this_00 = ::std::unique_ptr<Rml::Geometry,_std::default_delete<Rml::Geometry>_>::operator->
                          (&this->decoration);
      Geometry::Release((Mesh *)&__range4,this_00,ReturnMesh);
      __end4 = ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::begin
                         ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)&__range4);
      vertex = (Vertex *)
               ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::end
                         ((vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *)&__range4);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<Rml::Vertex_*,_std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>_>
                                         *)&vertex), bVar3) {
        render_manager =
             (RenderManager *)
             __gnu_cxx::
             __normal_iterator<Rml::Vertex_*,_std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>_>
             ::operator*(&__end4);
        *(ColourbPremultiplied *)
         &(render_manager->geometry_list).elements.
          super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
          ._M_impl.super__Vector_impl_data._M_start = this->colour;
        __gnu_cxx::
        __normal_iterator<Rml::Vertex_*,_std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>_>::
        operator++(&__end4);
      }
      local_b8._32_8_ = Element::GetRenderManager(&this->super_Element);
      if ((RenderManager *)local_b8._32_8_ != (RenderManager *)0x0) {
        RenderManager::MakeGeometry((RenderManager *)local_b8,(Mesh *)local_b8._32_8_);
        this_01 = ::std::unique_ptr<Rml::Geometry,_std::default_delete<Rml::Geometry>_>::operator*
                            (&this->decoration);
        Geometry::operator=(this_01,(Geometry *)local_b8);
        Geometry::~Geometry((Geometry *)local_b8);
      }
      Mesh::~Mesh((Mesh *)&__range4);
    }
  }
  return;
}

Assistant:

void ElementText::OnPropertyChange(const PropertyIdSet& changed_properties)
{
	RMLUI_ZoneScoped;

	Element::OnPropertyChange(changed_properties);

	bool colour_changed = false;
	bool font_face_changed = false;
	auto& computed = GetComputedValues();

	if (changed_properties.Contains(PropertyId::Color) || changed_properties.Contains(PropertyId::Opacity))
	{
		const float new_opacity = computed.opacity();
		const bool opacity_changed = opacity != new_opacity;

		ColourbPremultiplied new_colour = computed.color().ToPremultiplied(new_opacity);
		colour_changed = colour != new_colour;

		if (colour_changed)
		{
			colour = new_colour;
		}
		if (opacity_changed)
		{
			opacity = new_opacity;
			font_effects_dirty = true;
			geometry_dirty = true;
		}
	}

	if (changed_properties.Contains(PropertyId::FontFamily) ||     //
		changed_properties.Contains(PropertyId::FontWeight) ||     //
		changed_properties.Contains(PropertyId::FontStyle) ||      //
		changed_properties.Contains(PropertyId::FontSize) ||       //
		changed_properties.Contains(PropertyId::LetterSpacing) ||  //
		changed_properties.Contains(PropertyId::RmlUi_Language) || //
		changed_properties.Contains(PropertyId::RmlUi_Direction))
	{
		font_face_changed = true;

		geometry.clear();
		geometry_dirty = true;

		font_effects_handle = 0;
		font_effects_dirty = true;
		font_handle_version = 0;
	}

	if (changed_properties.Contains(PropertyId::FontEffect))
	{
		font_effects_dirty = true;
	}

	if (changed_properties.Contains(PropertyId::TextDecoration))
	{
		decoration_property = computed.text_decoration();
		if (decoration && decoration_property == Style::TextDecoration::None)
			decoration.reset();
	}

	if (font_face_changed)
	{
		// We have to let our document know we need to be regenerated.
		if (dirty_layout_on_change)
			DirtyLayout();
	}
	else if (colour_changed)
	{
		// Force the geometry to be regenerated.
		geometry_dirty = true;

		// Re-colour the decoration geometry.
		if (decoration)
		{
			Mesh mesh = decoration->Release();
			for (Vertex& vertex : mesh.vertices)
				vertex.colour = colour;

			if (RenderManager* render_manager = GetRenderManager())
				*decoration = render_manager->MakeGeometry(std::move(mesh));
		}
	}
}